

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::
CommandDiagGetQuery(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)
::$_0::~__0(__0 *this)

{
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::_Function_base::~_Function_base((_Function_base *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::CommandDiagGetQuery(const std::string &aAddr, uint64_t aDiagDataFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };
    CommandDiagGetQuery(wait, aAddr, aDiagDataFlags);
    return pro.get_future().get();
}